

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::Rollup::SortAndAggregateRows
          (Rollup *this,RollupRow *row,Rollup *base,Options *options,bool is_toplevel)

{
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *this_00;
  int iVar1;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  _Var2;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  _Var3;
  double dVar4;
  bool bVar5;
  __type_conflict _Var6;
  ulong uVar7;
  const_iterator cVar8;
  Rollup *base_00;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  _Var9;
  Arg *pAVar10;
  Rollup *this_01;
  undefined7 in_register_00000081;
  Arg *a0;
  Arg *pAVar11;
  Arg *pAVar12;
  iterator __begin2;
  pointer pRVar13;
  long lVar14;
  pointer pRVar15;
  string_view format;
  string_view format_00;
  Rollup *local_1e8;
  string local_1d8;
  Rollup others_rollup;
  RollupRow others_row;
  Rollup others_base;
  size_type local_60;
  pointer local_58;
  
  a0 = (Arg *)CONCAT71(in_register_00000081,is_toplevel);
  this_00 = &row->sorted_children;
  if ((((int)a0 == 0) &&
      (pRVar13 = (row->sorted_children).
                 super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                 super__Vector_impl_data._M_start,
      (long)(row->sorted_children).
            super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pRVar13 == 0x88)) &&
     ((bVar5 = std::operator==(&pRVar13->name,"[None]"), bVar5 ||
      (bVar5 = std::operator==(&((this_00->
                                 super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->name,"[Unmapped]"),
      bVar5)))) {
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::clear(this_00);
  }
  pRVar13 = (row->sorted_children).
            super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(row->sorted_children).
             super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)pRVar13 == 0x88) &&
     (_Var6 = std::operator==(&pRVar13->name,&row->name), _Var6)) {
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::clear(this_00);
  }
  _Var2._M_current =
       (row->sorted_children).
       super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var3._M_current =
       (row->sorted_children).
       super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var2._M_current != _Var3._M_current) {
    iVar1 = options->sort_by_;
    for (_Var9._M_current = _Var2._M_current; _Var9._M_current != _Var3._M_current;
        _Var9._M_current = _Var9._M_current + 1) {
      if (iVar1 == 0) {
        pAVar10 = (Arg *)((_Var9._M_current)->size).vm;
        a0 = (Arg *)((_Var9._M_current)->size).file;
        pAVar11 = (Arg *)-(long)pAVar10;
        if (0 < (long)pAVar10) {
          pAVar11 = pAVar10;
        }
        pAVar10 = (Arg *)-(long)a0;
        if (0 < (long)a0) {
          pAVar10 = a0;
        }
        if (pAVar10 < pAVar11) {
          pAVar10 = pAVar11;
        }
      }
      else {
        if (iVar1 == 2) {
          a0 = (Arg *)((_Var9._M_current)->size).file;
        }
        else {
          if (iVar1 != 1) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                          ,0x1e3,
                          "void bloaty::Rollup::SortAndAggregateRows(RollupRow *, const Rollup *, const Options &, bool) const"
                         );
          }
          a0 = (Arg *)((_Var9._M_current)->size).vm;
        }
        pAVar10 = (Arg *)-(long)a0;
        if (0 < (long)a0) {
          pAVar10 = a0;
        }
      }
      (_Var9._M_current)->sortkey = (int64_t)pAVar10;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<bloaty::RollupRow*,std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(bloaty::RollupRow_const&,bloaty::RollupRow_const&)>>
              (_Var2,_Var3,
               (_Iter_comp_iter<bool_(*)(const_bloaty::RollupRow_&,_const_bloaty::RollupRow_&)>)
               0x16f75c);
    RollupRow::RollupRow(&others_row,(string *)others_label_abi_cxx11_);
    others_row.other_count =
         ((long)(row->sorted_children).
                super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)(row->sorted_children).
               super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
               super__Vector_impl_data._M_start) / 0x88 - options->max_rows_per_level_;
    absl::substitute_internal::Arg::Arg((Arg *)&others_rollup,others_row.other_count);
    format._M_str = (char *)&others_rollup;
    format._M_len = (size_t)"[$0 Others]";
    absl::Substitute_abi_cxx11_((string *)&others_base,(absl *)0xb,format,a0);
    local_1e8 = &others_base;
    std::__cxx11::string::operator=((string *)&others_row,(string *)local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
    others_rollup.children_._M_h._M_buckets = &others_rollup.children_._M_h._M_single_bucket;
    others_rollup.filter_regex_ = (ReImpl *)0x0;
    others_rollup.filtered_vm_total_ = 0;
    others_rollup.filtered_file_total_ = 0;
    others_rollup.vm_total_ = 0;
    others_rollup.file_total_ = 0;
    others_rollup.children_._M_h._M_bucket_count = 1;
    others_rollup.children_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    others_rollup.children_._M_h._M_element_count = 0;
    others_rollup.children_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    others_rollup.children_._M_h._M_rehash_policy._M_next_resize = 0;
    others_rollup.children_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    others_base.children_._M_h._M_buckets = &others_base.children_._M_h._M_single_bucket;
    others_base.filtered_vm_total_ = 0;
    others_base.filtered_file_total_ = 0;
    others_base.vm_total_ = 0;
    others_base.file_total_ = 0;
    others_base.filter_regex_ = (ReImpl *)0x0;
    others_base.children_._M_h._M_bucket_count = 1;
    others_base.children_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    others_base.children_._M_h._M_element_count = 0;
    others_base.children_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    others_base.children_._M_h._M_rehash_policy._M_next_resize = 0;
    others_base.children_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    uVar7 = ((long)(row->sorted_children).
                   super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl
                   .super__Vector_impl_data._M_finish -
            (long)(row->sorted_children).
                  super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x88;
    lVar14 = uVar7 * 0x88;
    while( true ) {
      uVar7 = uVar7 - 1;
      if (uVar7 < (ulong)options->max_rows_per_level_) break;
      CheckedAdd(&others_row.size.vm,
                 *(int64_t *)
                  ((long)&(this_00->
                          super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>)
                          ._M_impl.super__Vector_impl_data._M_start[-1].size.vm + lVar14));
      CheckedAdd(&others_row.size.file,
                 *(int64_t *)
                  ((long)&(this_00->
                          super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>)
                          ._M_impl.super__Vector_impl_data._M_start[-1].size.file + lVar14));
      if ((base != (Rollup *)0x0) &&
         (cVar8 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(base->children_)._M_h,
                         (key_type *)
                         ((long)&(this_00->
                                 super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>
                                 )._M_impl.super__Vector_impl_data._M_start[-1].name._M_dataplus.
                                 _M_p + lVar14)),
         cVar8.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
         ._M_cur != (__node_type *)0x0)) {
        CheckedAdd(&others_base.vm_total_,
                   **(int64_t **)
                     ((long)cVar8.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
                            ._M_cur + 0x28));
        CheckedAdd(&others_base.file_total_,
                   *(int64_t *)
                    (*(long *)((long)cVar8.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
                                     ._M_cur + 0x28) + 8));
      }
      std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::erase
                (this_00,(row->sorted_children).
                         super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>.
                         _M_impl.super__Vector_impl_data._M_finish + -1);
      lVar14 = lVar14 + -0x88;
    }
    if (others_row.size.file != 0 || others_row.size.vm != 0) {
      std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::push_back
                (this_00,&others_row);
      CheckedAdd(&others_rollup.vm_total_,others_row.size.vm);
      CheckedAdd(&others_rollup.file_total_,others_row.size.file);
    }
    _Var3._M_current =
         (row->sorted_children).
         super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
         super__Vector_impl_data._M_finish;
    iVar1 = options->sort_by_;
    _Var2._M_current =
         (row->sorted_children).
         super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
         super__Vector_impl_data._M_start;
    for (_Var9._M_current = _Var2._M_current; _Var9._M_current != _Var3._M_current;
        _Var9._M_current = _Var9._M_current + 1) {
      if (iVar1 == 0) {
        pAVar10 = (Arg *)((_Var9._M_current)->size).vm;
        a0 = (Arg *)((_Var9._M_current)->size).file;
        pAVar11 = (Arg *)-(long)pAVar10;
        if (0 < (long)pAVar10) {
          pAVar11 = pAVar10;
        }
        pAVar12 = (Arg *)-(long)a0;
        if (0 < (long)a0) {
          pAVar12 = a0;
        }
        if (pAVar12 < pAVar11) goto LAB_0016a149;
        (_Var9._M_current)->sortkey = (int64_t)a0;
      }
      else {
        if (iVar1 == 2) {
          pAVar10 = (Arg *)((_Var9._M_current)->size).file;
        }
        else {
          if (iVar1 != 1) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                          ,0x218,
                          "void bloaty::Rollup::SortAndAggregateRows(RollupRow *, const Rollup *, const Options &, bool) const"
                         );
          }
          pAVar10 = (Arg *)((_Var9._M_current)->size).vm;
        }
LAB_0016a149:
        (_Var9._M_current)->sortkey = (int64_t)pAVar10;
      }
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<bloaty::RollupRow*,std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(bloaty::RollupRow_const&,bloaty::RollupRow_const&)>>
              (_Var2,_Var3,
               (_Iter_comp_iter<bool_(*)(const_bloaty::RollupRow_&,_const_bloaty::RollupRow_&)>)
               0x16f75c);
    pRVar13 = (row->sorted_children).
              super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
              super__Vector_impl_data._M_start;
    pRVar15 = (row->sorted_children).
              super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (base == (Rollup *)0x0) {
      for (; pRVar13 != pRVar15; pRVar13 = pRVar13 + 1) {
        dVar4 = Percent((pRVar13->size).vm,(row->size).vm);
        pRVar13->vmpercent = dVar4;
        dVar4 = Percent((pRVar13->size).file,(row->size).file);
        pRVar13->filepercent = dVar4;
      }
      pRVar13 = (row->sorted_children).
                super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                super__Vector_impl_data._M_start;
      pRVar15 = (row->sorted_children).
                super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_1e8 = (Rollup *)0x0;
    }
    for (; pRVar13 != pRVar15; pRVar13 = pRVar13 + 1) {
      base_00 = local_1e8;
      this_01 = &others_rollup;
      if (pRVar13->other_count < 1) {
        cVar8 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->children_)._M_h,&pRVar13->name);
        if (cVar8.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_58 = (pRVar13->name)._M_dataplus._M_p;
          local_60 = (pRVar13->name)._M_string_length;
          format_00._M_str = (char *)&local_60;
          format_00._M_len = (size_t)"internal error, couldn\'t find name $0";
          absl::Substitute_abi_cxx11_(&local_1d8,(absl *)0x25,format_00,a0);
          Throw(local_1d8._M_dataplus._M_p,0x233);
        }
        this_01 = *(Rollup **)
                   ((long)cVar8.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
                          ._M_cur + 0x28);
        if (this_01 == (Rollup *)0x0) {
          __assert_fail("child_rollup",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                        ,0x236,
                        "void bloaty::Rollup::SortAndAggregateRows(RollupRow *, const Rollup *, const Options &, bool) const"
                       );
        }
        if (base == (Rollup *)0x0) {
          base_00 = (Rollup *)0x0;
        }
        else {
          cVar8 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(base->children_)._M_h,&pRVar13->name);
          if (cVar8.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            base_00 = GetEmpty();
          }
          else {
            base_00 = *(Rollup **)
                       ((long)cVar8.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
                              ._M_cur + 0x28);
          }
        }
      }
      a0 = (Arg *)0x0;
      CreateRows(this_01,pRVar13,base_00,options,false);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&others_base.children_._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&others_rollup.children_._M_h);
    RollupRow::~RollupRow(&others_row);
  }
  return;
}

Assistant:

void Rollup::SortAndAggregateRows(RollupRow* row, const Rollup* base,
                                  const Options& options,
                                  bool is_toplevel) const {
  std::vector<RollupRow>& child_rows = row->sorted_children;

  // We don't want to output a solitary "[None]" or "[Unmapped]" row except at
  // the top level.
  if (!is_toplevel && child_rows.size() == 1 &&
      (child_rows[0].name == "[None]" || child_rows[0].name == "[Unmapped]")) {
    child_rows.clear();
  }

  // We don't want to output a single row that has exactly the same size and
  // label as the parent.
  if (child_rows.size() == 1 && child_rows[0].name == row->name) {
    child_rows.clear();
  }

  if (child_rows.empty()) {
    return;
  }

  // First sort by magnitude.
  for (auto& child : child_rows) {
    switch (options.sort_by()) {
      case Options::SORTBY_VMSIZE:
        child.sortkey = std::abs(child.size.vm);
        break;
      case Options::SORTBY_FILESIZE:
        child.sortkey = std::abs(child.size.file);
        break;
      case Options::SORTBY_BOTH:
        child.sortkey =
            std::max(std::abs(child.size.vm), std::abs(child.size.file));
        break;
      default:
        BLOATY_UNREACHABLE();
    }
  }

  std::sort(child_rows.begin(), child_rows.end(), &RollupRow::Compare);

  RollupRow others_row(others_label);
  others_row.other_count = child_rows.size() - options.max_rows_per_level();
  others_row.name = absl::Substitute("[$0 Others]", others_row.other_count);
  Rollup others_rollup;
  Rollup others_base;

  // Filter out everything but the top 'row_limit'.  Add rows that were filtered
  // out to "others_row".
  size_t i = child_rows.size() - 1;
  while (i >= options.max_rows_per_level()) {
    CheckedAdd(&others_row.size.vm, child_rows[i].size.vm);
    CheckedAdd(&others_row.size.file, child_rows[i].size.file);
    if (base) {
      auto it = base->children_.find(child_rows[i].name);
      if (it != base->children_.end()) {
        CheckedAdd(&others_base.vm_total_, it->second->vm_total_);
        CheckedAdd(&others_base.file_total_, it->second->file_total_);
      }
    }

    child_rows.erase(child_rows.end() - 1);
    i--;
  }

  if (std::abs(others_row.size.vm) > 0 || std::abs(others_row.size.file) > 0) {
    child_rows.push_back(others_row);
    CheckedAdd(&others_rollup.vm_total_, others_row.size.vm);
    CheckedAdd(&others_rollup.file_total_, others_row.size.file);
  }

  // Now sort by actual value (positive or negative).
  for (auto& child : child_rows) {
    switch (options.sort_by()) {
      case Options::SORTBY_VMSIZE:
        child.sortkey = child.size.vm;
        break;
      case Options::SORTBY_FILESIZE:
        child.sortkey = child.size.file;
        break;
      case Options::SORTBY_BOTH:
        if (std::abs(child.size.vm) > std::abs(child.size.file)) {
          child.sortkey = child.size.vm;
        } else {
          child.sortkey = child.size.file;
        }
        break;
      default:
        BLOATY_UNREACHABLE();
    }
  }

  std::sort(child_rows.begin(), child_rows.end(), &RollupRow::Compare);

  // For a non-diff, the percentage is compared to the total size of the parent.
  if (!base) {
    for (auto& child_row : child_rows) {
      child_row.vmpercent = Percent(child_row.size.vm, row->size.vm);
      child_row.filepercent = Percent(child_row.size.file, row->size.file);
    }
  }

  // Recurse into sub-rows, (except "Other", which isn't a real row).
  for (auto& child_row : child_rows) {
    const Rollup* child_rollup;
    const Rollup* child_base = nullptr;

    if (child_row.other_count > 0) {
      child_rollup = &others_rollup;
      if (base) {
        child_base = &others_base;
      }
    } else {
      auto it = children_.find(child_row.name);
      if (it == children_.end()) {
        THROWF("internal error, couldn't find name $0", child_row.name);
      }
      child_rollup = it->second.get();
      assert(child_rollup);

      if (base) {
        auto it = base->children_.find(child_row.name);
        if (it == base->children_.end()) {
          child_base = GetEmpty();
        } else {
          child_base = it->second.get();
        }
      }
    }

    child_rollup->CreateRows(&child_row, child_base, options, false);
  }
}